

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

llb_build_value_file_info_t *
llb_buildsystem_command_interface_get_file_info
          (llb_build_value_file_info_t *__return_storage_ptr__,llb_buildsystem_interface_t *bi_p,
          char *path)

{
  FileSystem *pFVar1;
  allocator local_91;
  long *local_90 [2];
  long local_80 [2];
  FileInfo local_70;
  
  pFVar1 = llbuild::buildsystem::BuildSystem::getFileSystem((BuildSystem *)bi_p);
  std::__cxx11::string::string((string *)local_90,path,&local_91);
  (*pFVar1->_vptr_FileSystem[7])(&local_70,pFVar1,(string *)local_90);
  llbuild::capi::convertFileInfo(&local_70);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

llb_build_value_file_info_t llb_buildsystem_command_interface_get_file_info(llb_buildsystem_interface_t* bi_p, const char* path) {
  auto bi = (BuildSystem*)bi_p;
  return llbuild::capi::convertFileInfo(bi->getFileSystem().getFileInfo(path));
}